

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * valueToText(sqlite3_value *pVal,u8 enc)

{
  int iVar1;
  byte in_SIL;
  long in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  void *local_8;
  
  if ((*(ushort *)(in_RDI + 0x14) & 0x12) == 0) {
    sqlite3VdbeMemStringify((Mem *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),'\0','\0');
  }
  else {
    if (((*(ushort *)(in_RDI + 0x14) & 0x400) != 0) &&
       (iVar1 = sqlite3VdbeMemExpandBlob((Mem *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8)),
       iVar1 != 0)) {
      return (void *)0x0;
    }
    *(ushort *)(in_RDI + 0x14) = *(ushort *)(in_RDI + 0x14) | 2;
    if (*(byte *)(in_RDI + 0x16) != (in_SIL & 0xf7)) {
      sqlite3VdbeChangeEncoding((Mem *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8),0);
    }
    if ((((in_SIL & 8) != 0) && (((uint)*(undefined8 *)(in_RDI + 8) & 1) == 1)) &&
       (iVar1 = sqlite3VdbeMemMakeWriteable((Mem *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8)),
       iVar1 != 0)) {
      return (void *)0x0;
    }
    sqlite3VdbeMemNulTerminate((Mem *)CONCAT17(in_SIL,in_stack_ffffffffffffffe8));
  }
  if (*(byte *)(in_RDI + 0x16) == (in_SIL & 0xf7)) {
    local_8 = *(void **)(in_RDI + 8);
  }
  else {
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

static SQLITE_NOINLINE const void *valueToText(sqlite3_value* pVal, u8 enc){
  assert( pVal!=0 );
  assert( pVal->db==0 || sqlite3_mutex_held(pVal->db->mutex) );
  assert( (enc&3)==(enc&~SQLITE_UTF16_ALIGNED) );
  assert( !sqlite3VdbeMemIsRowSet(pVal) );
  assert( (pVal->flags & (MEM_Null))==0 );
  if( pVal->flags & (MEM_Blob|MEM_Str) ){
    if( ExpandBlob(pVal) ) return 0;
    pVal->flags |= MEM_Str;
    if( pVal->enc != (enc & ~SQLITE_UTF16_ALIGNED) ){
      sqlite3VdbeChangeEncoding(pVal, enc & ~SQLITE_UTF16_ALIGNED);
    }
    if( (enc & SQLITE_UTF16_ALIGNED)!=0 && 1==(1&SQLITE_PTR_TO_INT(pVal->z)) ){
      assert( (pVal->flags & (MEM_Ephem|MEM_Static))!=0 );
      if( sqlite3VdbeMemMakeWriteable(pVal)!=SQLITE_OK ){
        return 0;
      }
    }
    sqlite3VdbeMemNulTerminate(pVal); /* IMP: R-31275-44060 */
  }else{
    sqlite3VdbeMemStringify(pVal, enc, 0);
    assert( 0==(1&SQLITE_PTR_TO_INT(pVal->z)) );
  }
  assert(pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) || pVal->db==0
              || pVal->db->mallocFailed );
  if( pVal->enc==(enc & ~SQLITE_UTF16_ALIGNED) ){
    assert( sqlite3VdbeMemValidStrRep(pVal) );
    return pVal->z;
  }else{
    return 0;
  }
}